

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O0

void __thiscall
choc::text::FloatToStringBuffer<float>::Limits::Limits(Limits *this,MantissaAndExponent value)

{
  long lVar1;
  uint64_t uVar2;
  MantissaAndExponent MVar3;
  uint64_t local_60;
  int local_58;
  undefined4 uStack_54;
  undefined4 uStack_44;
  undefined4 uStack_34;
  undefined4 uStack_24;
  Limits *this_local;
  MantissaAndExponent value_local;
  
  uVar2 = value.mantissa;
  local_58 = value.exponent;
  (this->upper).mantissa = uVar2 * 2 + 1;
  *(ulong *)&(this->upper).exponent = CONCAT44(uStack_24,local_58 + -1);
  while (((this->upper).mantissa & 0x1000000) == 0) {
    MVar3 = MantissaAndExponent::shiftedUp(&this->upper,1);
    (this->upper).mantissa = MVar3.mantissa;
    *(ulong *)&(this->upper).exponent = CONCAT44(uStack_34,MVar3.exponent);
  }
  MVar3 = MantissaAndExponent::shiftedUp(&this->upper,0x27);
  (this->upper).mantissa = MVar3.mantissa;
  *(ulong *)&(this->upper).exponent = CONCAT44(uStack_44,MVar3.exponent);
  if (uVar2 == 0x800000) {
    lVar1 = 0x2000000;
    local_58 = local_58 + -2;
  }
  else {
    lVar1 = uVar2 * 2;
    local_58 = local_58 + -1;
  }
  local_60 = lVar1 - 1;
  (this->lower).mantissa = local_60;
  *(ulong *)&(this->lower).exponent = CONCAT44(uStack_54,local_58);
  (this->lower).mantissa =
       (this->lower).mantissa <<
       ((char)(this->lower).exponent - (char)(this->upper).exponent & 0x3fU);
  (this->lower).exponent = (this->upper).exponent;
  return;
}

Assistant:

constexpr Limits (MantissaAndExponent value)
        {
            upper = { (value.mantissa << 1) + 1, value.exponent - 1 };

            while ((upper.mantissa & (hiddenBit << 1)) == 0)
                upper = upper.shiftedUp (1);

            upper = upper.shiftedUp (static_cast<int> (sizeof (upper.mantissa) * 8 - numSignificandBits - 2));

            lower = value.mantissa == hiddenBit ? MantissaAndExponent { (value.mantissa << 2) - 1, value.exponent - 2 }
                                                : MantissaAndExponent { (value.mantissa << 1) - 1, value.exponent - 1 };
            lower.mantissa <<= lower.exponent - upper.exponent;
            lower.exponent = upper.exponent;
        }